

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OrderParameterProbZ.cpp
# Opt level: O0

void __thiscall OpenMD::OrderParameterProbZ::writeOrderCount(OrderParameterProbZ *this)

{
  byte bVar1;
  char *pcVar2;
  ostream *poVar3;
  size_type sVar4;
  reference pvVar5;
  undefined8 uVar6;
  long in_RDI;
  undefined1 auVar7 [16];
  RealType prop;
  RealType order;
  uint i;
  ofstream rdfStream;
  double local_228;
  uint local_218;
  ostream local_208 [520];
  
  pcVar2 = (char *)std::__cxx11::string::c_str();
  std::ofstream::ofstream(local_208,pcVar2,_S_out);
  bVar1 = std::ofstream::is_open();
  if ((bVar1 & 1) == 0) {
    uVar6 = std::__cxx11::string::c_str();
    snprintf(painCave.errMsg,2000,"OrderProb: unable to open %s\n",uVar6);
    painCave.isFatal = 1;
    simError();
  }
  else {
    poVar3 = std::operator<<(local_208,"#Order count probablity ");
    std::operator<<(poVar3,"\n");
    poVar3 = std::operator<<(local_208,"#selection: (");
    poVar3 = std::operator<<(poVar3,(string *)(in_RDI + 0xd8));
    std::operator<<(poVar3,")\n");
    poVar3 = std::operator<<(local_208,"# Prefered Axis:");
    poVar3 = std::operator<<(poVar3,(string *)(in_RDI + 0x798));
    std::operator<<(poVar3,"\n##Order\tProbOrderCount\n");
    for (local_218 = 0;
        sVar4 = std::vector<double,_std::allocator<double>_>::size
                          ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x778)),
        local_218 < sVar4; local_218 = local_218 + 1) {
      sVar4 = std::vector<double,_std::allocator<double>_>::size
                        ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x778));
      auVar7._8_4_ = (int)(sVar4 >> 0x20);
      auVar7._0_8_ = sVar4;
      auVar7._12_4_ = 0x45300000;
      if (*(int *)(in_RDI + 0xd0) == 0) {
        pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x778),
                            (ulong)local_218);
        local_228 = *pvVar5;
      }
      else {
        pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x778),
                            (ulong)local_218);
        local_228 = *pvVar5 / (double)*(int *)(in_RDI + 0xd0);
      }
      poVar3 = (ostream *)
               std::ostream::operator<<
                         (local_208,
                          (double)local_218 *
                          (2.0 / ((auVar7._8_8_ - 1.9342813113834067e+25) +
                                 ((double)CONCAT44(0x43300000,(int)sVar4) - 4503599627370496.0))));
      poVar3 = std::operator<<(poVar3,"\t");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_228);
      std::operator<<(poVar3,"\n");
    }
  }
  std::ofstream::close();
  std::ofstream::~ofstream(local_208);
  return;
}

Assistant:

void OrderParameterProbZ::writeOrderCount() {
    std::ofstream rdfStream(outputFilename_.c_str());
    if (rdfStream.is_open()) {
      rdfStream << "#Order count probablity "
                << "\n";
      rdfStream << "#selection: (" << selectionScript_ << ")\n";
      rdfStream << "# Prefered Axis:" << axisLabel_
                << "\n##Order\tProbOrderCount\n";
      for (unsigned int i = 0; i < Count_.size(); ++i) {
        RealType order = i * (2.0 / Count_.size());
        RealType prop;
        if (totalCount_ == 0)
          prop = Count_[i];
        else
          prop = Count_[i] / totalCount_;
        rdfStream << order << "\t" << prop << "\n";
      }

    } else {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "OrderProb: unable to open %s\n", outputFilename_.c_str());
      painCave.isFatal = 1;
      simError();
    }

    rdfStream.close();
  }